

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int ns_resolve2(char *host,in_addr *ina)

{
  hostent *phVar1;
  
  phVar1 = gethostbyname(host);
  if (phVar1 != (hostent *)0x0) {
    ina->s_addr = *(in_addr_t *)*phVar1->h_addr_list;
  }
  return (uint)(phVar1 != (hostent *)0x0);
}

Assistant:

static int ns_resolve2(const char *host, struct in_addr *ina) {
  struct hostent *he;
  if ((he = gethostbyname(host)) == NULL) {
    DBG(("gethostbyname(%s) failed: %s", host, strerror(errno)));
  } else {
    memcpy(ina, he->h_addr_list[0], sizeof(*ina));
    return 1;
  }
  return 0;
}